

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGNSPlanner.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
PerseusBGNSPlanner::BackupStageSampling
          (QFunctionsDiscrete *__return_storage_ptr__,PerseusBGNSPlanner *this,BeliefSet *S,
          QFunctionsDiscrete *Q)

{
  _func_int *p_Var1;
  JointBeliefInterface *pJVar2;
  pointer pAVar3;
  pointer pAVar4;
  bool bVar5;
  int k;
  pointer pvVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ostream *poVar10;
  uint a;
  AlphaVector *this_00;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  size_type sVar14;
  PlanningUnitMADPDiscrete *this_01;
  int iVar15;
  pointer pdVar16;
  double dVar17;
  QFunctionsDiscrete *Q1;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  ValueFunctionPOMDPDiscrete Qalphas;
  vector<double,_std::allocator<double>_> VB;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  QB;
  AlphaVector alpha;
  ValueFunctionPOMDPDiscrete V;
  GaoVectorSet Gao;
  pointer local_2a0;
  void *local_298;
  ulong local_268;
  vector<bool,_std::allocator<bool>_> local_260;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_238;
  Perseus *local_218;
  vector<double,_std::allocator<double>_> local_210;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1f8;
  ulong local_1d8;
  double local_1d0;
  vector<bool,_std::allocator<bool>_> local_1c8;
  AlphaVector local_1a0;
  void *local_178;
  BGPolicyIndex BStack_170;
  pointer local_168;
  ValueFunctionPOMDPDiscrete local_150;
  GaoVectorSet local_138;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b8;
  
  BeliefValue::GetValues(&local_210,S,Q);
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = (Q->
           super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((Q->
      super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
    uVar9 = 0;
    uVar11 = 1;
    do {
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_138,S,pvVar6 + uVar9)
      ;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&local_1f8,(vector<double,_std::allocator<double>_> *)&local_138);
      pvVar12 = (void *)CONCAT71(local_138.
                                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                 .
                                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                 .base_._1_7_,
                                 local_138.
                                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                 .
                                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                 .base_._0_1_);
      if (pvVar12 != (void *)0x0) {
        operator_delete(pvVar12,local_138.
                                super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                                .
                                super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                                .storage_.ordering_.elems[1] - (long)pvVar12);
      }
      pvVar6 = (Q->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = ((long)(Q->
                      super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
               -0x5555555555555555 - uVar11;
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (lVar13 != 0);
  }
  p_Var1 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
  this_01 = *(PlanningUnitMADPDiscrete **)
             (p_Var1 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
  if (this_01 == (PlanningUnitMADPDiscrete *)0x0) {
    this_01 = *(PlanningUnitMADPDiscrete **)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var1)
    ;
  }
  local_268 = (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sVar7 = PlanningUnitMADPDiscrete::GetNrStates(this_01);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_138);
  local_268 = local_268 >> 3;
  local_138.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_260,(long)(int)local_268,(bool *)&local_138,(allocator_type *)&local_1a0);
  AlphaVector::AlphaVector(&local_1a0,(long)(int)sVar7);
  AlphaVectorPlanning::QFunctionsToValueFunction(&local_150,Q);
  local_218 = (Perseus *)&(this->super_AlphaVectorBG).field_0x18;
  Perseus::BackupStageLeadIn(&local_138,local_218,&local_150);
  local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (AlphaVector *)0x0;
  local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (AlphaVector *)0x0;
  local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)local_268 == 0) {
    pdVar16 = (pointer)0x0;
    pvVar12 = (void *)0x0;
  }
  else {
    local_1d8 = local_268 & 0xffffffff;
    local_298 = (void *)0x0;
    local_2a0 = (pointer)0x0;
    do {
      std::vector<bool,_std::allocator<bool>_>::vector(&local_1c8,&local_260);
      k = Perseus::SampleNotImprovedBeliefIndex(local_218,&local_1c8,(int)local_268);
      if (local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_1c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      pAVar4 = local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pAVar3 = local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          AlphaVector::~AlphaVector(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != pAVar4);
        local_238.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
        super__Vector_impl_data._M_finish = pAVar3;
      }
      lVar13 = (long)k;
      a = 0;
      while( true ) {
        p_Var1 = (this->super_AlphaVectorBG)._vptr_AlphaVectorBG[-3];
        lVar8 = *(long *)(p_Var1 + 8 + (long)&(this->super_AlphaVectorBG)._m_bgip.px);
        if (lVar8 == 0) {
          lVar8 = *(long *)(&(this->super_AlphaVectorBG).field_0x18 + (long)p_Var1);
        }
        uVar9 = (**(code **)(**(long **)(lVar8 + 0x30) + 0x68))();
        uVar11 = (ulong)a;
        if (uVar9 == uVar11) break;
        AlphaVectorBG::BeliefBackup
                  ((AlphaVector *)&local_178,&this->super_AlphaVectorBG,
                   (S->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar13],a,&local_138,&local_150,
                   *(BGBackupType *)&(this->super_AlphaVectorBG).field_0xc8);
        AlphaVector::operator=(&local_1a0,(AlphaVector *)&local_178);
        AlphaVector::~AlphaVector((AlphaVector *)&local_178);
        pJVar2 = (S->
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar13];
        dVar17 = (double)(**(code **)(*(long *)((long)&pJVar2->field_0x0 +
                                               *(long *)((long)*pJVar2 + -0xb8)) + 0x80))
                                   ((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8),
                                    &local_1a0._m_values);
        local_1d0 = local_1f8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13];
        if (local_1d0 <= dVar17) {
          if (*(int *)&(this->super_AlphaVectorBG).field_0x28 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Added vector for action ",0x18);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", belief ",9);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,k);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," (Q ",4);
            poVar10 = std::ostream::_M_insert<double>(dVar17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," >= ",4);
            poVar10 = std::ostream::_M_insert<double>(local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
        else {
          BeliefValue::GetMaximizingVector
                    ((AlphaVector *)&local_178,S,k,
                     (Q->
                     super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar11);
          AlphaVector::operator=(&local_1a0,(AlphaVector *)&local_178);
          AlphaVector::~AlphaVector((AlphaVector *)&local_178);
        }
        bVar5 = AlphaVectorPlanning::VectorIsInValueFunction
                          (&local_1a0,
                           (__return_storage_ptr__->
                           super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar11);
        if (!bVar5) {
          std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                    ((__return_storage_ptr__->
                     super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar11,&local_1a0);
        }
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&local_238,&local_1a0);
        a = a + 1;
      }
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_178,S,&local_238);
      pdVar16 = local_168;
      pvVar12 = local_178;
      local_178 = (void *)0x0;
      BStack_170 = 0;
      local_168 = (pointer)0x0;
      if (local_298 != (void *)0x0) {
        operator_delete(local_298,(long)local_2a0 - (long)local_298);
      }
      if (local_178 != (void *)0x0) {
        operator_delete(local_178,(long)local_168 - (long)local_178);
      }
      uVar9 = 0;
      iVar15 = 0;
      do {
        if (((local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) &&
           (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] <= *(double *)((long)pvVar12 + uVar9 * 8))) {
          local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] =
               ~(1L << (uVar9 & 0x3f)) &
               local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6];
          local_268 = (ulong)((int)local_268 - 1);
          iVar15 = iVar15 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (local_1d8 != uVar9);
      if (*(int *)&(this->super_AlphaVectorBG).field_0x28 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Added vectors for ",0x12);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," (V ",4);
        poVar10 = std::ostream::_M_insert<double>(*(double *)((long)pvVar12 + lVar13 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," improved ",10);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      local_2a0 = pdVar16;
      local_298 = pvVar12;
    } while ((int)local_268 != 0);
  }
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)CONCAT71(local_138.
                        super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                        .
                        super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                        .base_._1_7_,
                        local_138.
                        super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                        .
                        super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                        .base_._0_1_);
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .index_base_list_.elems[0] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .index_base_list_.elems[0];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .index_base_list_.elems[1] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .index_base_list_.elems[1];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .origin_offset_ =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .origin_offset_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .directional_offset_ =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .directional_offset_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .num_elements_ =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .num_elements_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ordering_.elems[0] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .storage_.ordering_.elems[0];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ordering_.elems[1] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .storage_.ordering_.elems[1];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ascending_.elems[0] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .storage_.ascending_.elems[0];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_.ascending_.elems[1] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .storage_.ascending_.elems[1];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .storage_._18_6_ =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .storage_._18_6_;
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .extent_list_.elems[0] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .extent_list_.elems[0];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .extent_list_.elems[1] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .extent_list_.elems[1];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .stride_list_.elems[0] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .stride_list_.elems[0];
  local_b8.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .stride_list_.elems[1] =
       local_138.
       super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
       .
       super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
       .stride_list_.elems[1];
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::allocate_space(&local_b8);
  if (local_138.
      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
      .
      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
      .num_elements_ != 0) {
    sVar14 = 0;
    do {
      local_b8.base_[sVar14] = local_138.base_[sVar14];
      sVar14 = sVar14 + 1;
    } while (local_138.
             super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
             .
             super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
             .num_elements_ != sVar14);
  }
  Perseus::BackupStageLeadOut(local_218,&local_b8);
  if (local_b8.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_b8.base_,local_b8.allocated_elements_ << 3);
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_238);
  if (local_138.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(local_138.base_,local_138.allocated_elements_ << 3);
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_150);
  AlphaVector::~AlphaVector(&local_1a0);
  if (local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1f8);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)pdVar16 - (long)pvVar12);
  }
  if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
PerseusBGNSPlanner::BackupStageSampling(const BeliefSet &S,
                                        const QFunctionsDiscrete &Q) 
    const
{
    vector<double> VB=BeliefValue::GetValues(S,Q),
        VBalpha;
    vector<vector<double> > QB;
    for(unsigned int a=0;a!=Q.size();++a)
        QB.push_back(BeliefValue::GetValues(S,Q[a]));

    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    double oldValue;
    QFunctionsDiscrete Q1(Q.size());
    vector<bool> stillNeedToBeImproved(nrB,true);
    AlphaVector alpha(nrS);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Q);
    GaoVectorSet Gao=BackupStageLeadIn(V);

    ValueFunctionPOMDPDiscrete Qalphas;

    while(nrNotImproved!=0)
    {
        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Qalphas.clear();
        for(unsigned int a=0;a!=GetPU()->GetNrJointActions();++a)
        {
            // backup the belief
            alpha=AlphaVectorBG::BeliefBackup(*S[k],a,Gao,V,_m_backupType);

            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());

            // if not, get copy from old value function
            oldValue=QB[a][k];//VB[k]
            if(x<oldValue)
            {
#if DEBUG_PerseusBGNSPlanner
                cout << "Getting n-1 vector for action " << a << ", belief "
                     << k << " (" << x << " < " <<oldValue << ")" << endl;
#endif
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
            }
            else
            {
                if(GetVerbose())
                    cout << "Added vector for action " << a << ", belief " 
                         << k << " (Q " << x << " >= " << oldValue << ")"
                         << endl;
            }
            // add alpha to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);
            Qalphas.push_back(alpha);
        }

        // update which beliefs have been improved
        VBalpha=BeliefValue::GetValues(S,Qalphas);
        int nrImprovedByAlpha=0;
        for(int b=0;b!=nrB;b++)
            if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
            {
                stillNeedToBeImproved[b]=false;
                nrNotImproved--;
                nrImprovedByAlpha++;
            }

        if(GetVerbose())
            cout << "Added vectors for " << k << " (V " << VBalpha[k] 
                 << " improved " << nrImprovedByAlpha << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}